

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

size_t fmt::v6::detail::count_code_points(basic_string_view<char> s)

{
  size_t sVar1;
  size_t i;
  
  sVar1 = 0;
  for (i = 0; s.size_ != i; i = i + 1) {
    sVar1 = sVar1 + 1;
  }
  return sVar1;
}

Assistant:

inline size_t count_code_points(basic_string_view<char> s) {
  const char* data = s.data();
  size_t num_code_points = 0;
  for (size_t i = 0, size = s.size(); i != size; ++i) {
    if ((data[i] & 0xc0) != 0x80) ++num_code_points;
  }
  return num_code_points;
}